

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O1

int __thiscall RenX_ExtraLoggingPlugin::think(RenX_ExtraLoggingPlugin *this)

{
  pointer pcVar1;
  tm *ptVar2;
  string line;
  time_t current_time;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  time_t local_20;
  
  if ((this->file != (FILE *)0x0) && ((this->newDayFmt)._M_string_length != 0)) {
    local_20 = time((time_t *)0x0);
    ptVar2 = localtime(&local_20);
    if (ptVar2->tm_yday != this->day) {
      this->day = ptVar2->tm_yday;
      pcVar1 = (this->newDayFmt)._M_dataplus._M_p;
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_40,pcVar1,pcVar1 + (this->newDayFmt)._M_string_length);
      RenX::processTags((string *)&local_40,(Server *)0x0,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                        (BuildingInfo *)0x0);
      fwrite(local_40,1,local_38,(FILE *)this->file);
      fputs("\r\n",(FILE *)this->file);
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
    }
  }
  return 0;
}

Assistant:

int RenX_ExtraLoggingPlugin::think() {
	if (RenX_ExtraLoggingPlugin::file != nullptr && !RenX_ExtraLoggingPlugin::newDayFmt.empty()) {
		time_t current_time = time(nullptr);
		int currentDay = localtime(&current_time)->tm_yday;
		if (currentDay != RenX_ExtraLoggingPlugin::day)
		{
			RenX_ExtraLoggingPlugin::day = currentDay;
			std::string line = RenX_ExtraLoggingPlugin::newDayFmt;
			RenX::processTags(line);
			fwrite(line.data(), sizeof(char), line.size(), file);
			fputs("\r\n", file);
		}
	}
	return 0;
}